

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

path * GetPidFile(path *__return_storage_ptr__,ArgsManager *args)

{
  string arg;
  long in_FS_OFFSET;
  _Alloc_hider _Var1;
  undefined1 in_stack_ffffffffffffff70 [24];
  undefined1 local_68 [72];
  path *local_20;
  
  local_20 = *(path **)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"-pid","");
  _Var1._M_p = BITCOIN_PID_FILENAME;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&stack0xffffffffffffff70,(char **)&stack0xffffffffffffff68,auto_format);
  arg._M_string_length = in_stack_ffffffffffffff70._0_8_;
  arg.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )in_stack_ffffffffffffff70._8_16_;
  arg._M_dataplus._M_p = _Var1._M_p;
  ArgsManager::GetPathArg((path *)(local_68 + 0x20),args,arg,(path *)local_68);
  AbsPathForConfigVal(__return_storage_ptr__,args,(path *)(local_68 + 0x20),true);
  std::filesystem::__cxx11::path::~path((path *)(local_68 + 0x20));
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff70);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (*(path **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(path **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static fs::path GetPidFile(const ArgsManager& args)
{
    return AbsPathForConfigVal(args, args.GetPathArg("-pid", BITCOIN_PID_FILENAME));
}